

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool __thiscall Input::cheat(Input *this)

{
  char cVar1;
  
  cVar1 = al_key_down(&this->kbdstate,0xd7);
  if ((cVar1 != '\0') && (cVar1 = al_key_down(&this->kbdstate,0x3e), cVar1 != '\0')) {
    return true;
  }
  return false;
}

Assistant:

bool Input::cheat(void)
{
   if (al_key_down(&kbdstate, ALLEGRO_KEY_LSHIFT)
         && al_key_down(&kbdstate, ALLEGRO_KEY_EQUALS))
      return true;
   else
      return false;
}